

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O2

void init_interp_filter_params
               (InterpFilterParams **interp_filter_params,InterpFilters *filter,int block_width,
               int block_height,int is_intrabc)

{
  byte bVar1;
  InterpFilterParams *pIVar2;
  InterpFilterParams *pIVar3;
  
  if (is_intrabc == 0) {
    bVar1 = (byte)filter->x_filter;
    pIVar3 = av1_interp_4tap + bVar1;
    if (bVar1 == 4) {
      pIVar3 = av1_interp_filter_params_list + bVar1;
    }
    if (4 < block_width) {
      pIVar3 = av1_interp_filter_params_list + bVar1;
    }
    bVar1 = (byte)filter->y_filter;
    pIVar2 = av1_interp_4tap + bVar1;
    if (bVar1 == 4) {
      pIVar2 = av1_interp_filter_params_list + bVar1;
    }
    if (4 < block_height) {
      pIVar2 = av1_interp_filter_params_list + bVar1;
    }
  }
  else {
    pIVar3 = &av1_intrabc_filter_params;
    pIVar2 = &av1_intrabc_filter_params;
  }
  *interp_filter_params = pIVar3;
  interp_filter_params[1] = pIVar2;
  return;
}

Assistant:

static inline void init_interp_filter_params(
    const InterpFilterParams *interp_filter_params[2],
    const InterpFilters *filter, int block_width, int block_height,
    int is_intrabc) {
  if (UNLIKELY(is_intrabc)) {
    interp_filter_params[0] = &av1_intrabc_filter_params;
    interp_filter_params[1] = &av1_intrabc_filter_params;
  } else {
    interp_filter_params[0] = av1_get_interp_filter_params_with_block_size(
        (InterpFilter)filter->x_filter, block_width);
    interp_filter_params[1] = av1_get_interp_filter_params_with_block_size(
        (InterpFilter)filter->y_filter, block_height);
  }
}